

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qboxlayout.cpp
# Opt level: O1

QLayoutItem * __thiscall
QBoxLayoutPrivate::replaceAt(QBoxLayoutPrivate *this,int index,QLayoutItem *item)

{
  long *plVar1;
  QLayoutItem *pQVar2;
  QBoxLayoutItem *pQVar3;
  
  if (item != (QLayoutItem *)0x0) {
    if ((ulong)(long)index < (ulong)(this->list).d.size) {
      pQVar3 = (this->list).d.ptr[index];
    }
    else {
      pQVar3 = (QBoxLayoutItem *)0x0;
    }
    if (pQVar3 != (QBoxLayoutItem *)0x0) {
      plVar1 = *(long **)&(this->super_QLayoutPrivate).field_0x8;
      pQVar2 = pQVar3->item;
      pQVar3->item = item;
      (**(code **)(*plVar1 + 0x70))();
      return pQVar2;
    }
  }
  return (QLayoutItem *)0x0;
}

Assistant:

QLayoutItem* QBoxLayoutPrivate::replaceAt(int index, QLayoutItem *item)
{
    Q_Q(QBoxLayout);
    if (!item)
        return nullptr;
    QBoxLayoutItem *b = list.value(index);
    if (!b)
        return nullptr;
    QLayoutItem *r = b->item;

    b->item = item;
    q->invalidate();
    return r;
}